

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

string * __thiscall
QPDFFormFieldObjectHelper::getFullyQualifiedName_abi_cxx11_
          (string *__return_storage_ptr__,QPDFFormFieldObjectHelper *this)

{
  bool bVar1;
  ulong uVar2;
  bool local_19a;
  allocator<char> local_179;
  string local_178 [32];
  QPDFObjectHandle local_158;
  allocator<char> local_141;
  string local_140 [32];
  QPDFObjectHandle local_120;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  allocator<char> local_a9;
  string local_a8 [32];
  QPDFObjectHandle local_88;
  QPDFObjGen local_78;
  undefined1 local_70 [8];
  set seen;
  QPDFObjectHandle node;
  QPDFFormFieldObjectHelper *this_local;
  string *result;
  
  node.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xffffffffffffffd0);
  QPDFObjGen::set::set((set *)local_70);
  while( true ) {
    bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)&stack0xffffffffffffffd0);
    local_19a = false;
    if (!bVar1) {
      local_78 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen
                           ((BaseHandle *)&stack0xffffffffffffffd0);
      local_19a = QPDFObjGen::set::add((set *)local_70,local_78);
    }
    if (local_19a == false) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_a8,"/T",&local_a9);
    QPDFObjectHandle::getKey(&local_88,(string *)&stack0xffffffffffffffd0);
    bVar1 = QPDFObjectHandle::isString(&local_88);
    QPDFObjectHandle::~QPDFObjectHandle(&local_88);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator(&local_a9);
    if (bVar1) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        QTC::TC("qpdf","QPDFFormFieldObjectHelper non-trivial qualified name",0);
        std::operator+(&local_d0,".",__return_storage_ptr__);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_140,"/T",&local_141);
      QPDFObjectHandle::getKey(&local_120,(string *)&stack0xffffffffffffffd0);
      QPDFObjectHandle::getUTF8Value_abi_cxx11_(&local_110,&local_120);
      std::operator+(&local_f0,&local_110,__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      QPDFObjectHandle::~QPDFObjectHandle(&local_120);
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator(&local_141);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_178,"/Parent",&local_179);
    QPDFObjectHandle::getKey(&local_158,(string *)&stack0xffffffffffffffd0);
    QPDFObjectHandle::operator=((QPDFObjectHandle *)&stack0xffffffffffffffd0,&local_158);
    QPDFObjectHandle::~QPDFObjectHandle(&local_158);
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator(&local_179);
  }
  node.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 1;
  QPDFObjGen::set::~set((set *)local_70);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffd0);
  if ((node.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFFormFieldObjectHelper::getFullyQualifiedName()
{
    std::string result;
    QPDFObjectHandle node = oh();
    QPDFObjGen::set seen;
    while (!node.isNull() && seen.add(node)) {
        if (node.getKey("/T").isString()) {
            if (!result.empty()) {
                QTC::TC("qpdf", "QPDFFormFieldObjectHelper non-trivial qualified name");
                result = "." + result;
            }
            result = node.getKey("/T").getUTF8Value() + result;
        }
        node = node.getKey("/Parent");
    }
    return result;
}